

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O0

JavascriptString * Js::JavascriptConversion::ToLocaleString(Var aValue,ScriptContext *scriptContext)

{
  code *pcVar1;
  anon_class_24_3_3aface9f implicitCall;
  bool bVar2;
  BOOL BVar3;
  int32 iVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  JavascriptBoolean *this;
  JavascriptLibrary *pJVar7;
  JavascriptTypedNumber<long> *this_00;
  long lVar8;
  JavascriptTypedNumber<unsigned_long> *this_01;
  unsigned_long uVar9;
  JavascriptSymbol *this_02;
  Var pvVar10;
  ThreadContext *this_03;
  PropertyRecord *this_04;
  char16 *varName;
  double value_00;
  undefined1 auVar11 [16];
  JavascriptString *local_80;
  Var aResult;
  RecyclableObject *toLocaleStringFunction;
  Var value;
  RecyclableObject *object;
  ScriptContext *scriptContext_local;
  Var aValue_local;
  TypeId local_18;
  TypeId typeId;
  
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(aValue);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aValue);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      pRVar6 = UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (pRVar6 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(pRVar6);
      if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(pRVar6), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
  }
  switch(local_18) {
  case TypeIds_Undefined:
    pJVar7 = ScriptContext::GetLibrary(scriptContext);
    aValue_local = JavascriptLibrary::GetUndefinedDisplayString(pJVar7);
    break;
  case TypeIds_Null:
    pJVar7 = ScriptContext::GetLibrary(scriptContext);
    aValue_local = JavascriptLibrary::GetNullDisplayString(pJVar7);
    break;
  case TypeIds_Boolean:
    this = UnsafeVarTo<Js::JavascriptBoolean>(aValue);
    BVar3 = JavascriptBoolean::GetValue(this);
    if (BVar3 == 0) {
      pJVar7 = ScriptContext::GetLibrary(scriptContext);
      local_80 = JavascriptLibrary::GetFalseDisplayString(pJVar7);
    }
    else {
      pJVar7 = ScriptContext::GetLibrary(scriptContext);
      local_80 = JavascriptLibrary::GetTrueDisplayString(pJVar7);
    }
    aValue_local = local_80;
    break;
  case TypeIds_FirstNumberType:
    iVar4 = TaggedInt::ToInt32(aValue);
    aValue_local = JavascriptNumber::ToLocaleString((double)iVar4,scriptContext);
    break;
  case TypeIds_Number:
    value_00 = JavascriptNumber::GetValue(aValue);
    aValue_local = JavascriptNumber::ToLocaleString(value_00,scriptContext);
    break;
  case TypeIds_Int64Number:
    this_00 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
    lVar8 = JavascriptTypedNumber<long>::GetValue(this_00);
    aValue_local = JavascriptNumber::ToLocaleString((double)lVar8,scriptContext);
    break;
  case TypeIds_LastNumberType:
    this_01 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
    uVar9 = JavascriptTypedNumber<unsigned_long>::GetValue(this_01);
    auVar11._8_4_ = (int)(uVar9 >> 0x20);
    auVar11._0_8_ = uVar9;
    auVar11._12_4_ = 0x45300000;
    aValue_local = JavascriptNumber::ToLocaleString
                             ((auVar11._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0),
                              scriptContext);
    break;
  default:
    pRVar6 = VarTo<Js::RecyclableObject>(aValue);
    pvVar10 = Js::JavascriptOperators::GetProperty
                        (pRVar6,0x172,scriptContext,(PropertyValueInfo *)0x0);
    bVar2 = IsCallable(pvVar10);
    if (!bVar2) {
      this_04 = ScriptContext::GetPropertyName(scriptContext,0x172);
      varName = PropertyRecord::GetBuffer(this_04);
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec45,varName);
    }
    pRVar6 = VarTo<Js::RecyclableObject>(pvVar10);
    this_03 = ScriptContext::GetThreadContext(scriptContext);
    implicitCall.toLocaleStringFunction = pRVar6;
    implicitCall.scriptContext = scriptContext;
    implicitCall.aValue = aValue;
    pvVar10 = ThreadContext::
              ExecuteImplicitCall<Js::JavascriptConversion::ToLocaleString(void*,Js::ScriptContext*)::__0>
                        (this_03,pRVar6,ImplicitCall_ToPrimitive,implicitCall);
    bVar2 = VarIs<Js::JavascriptString>(pvVar10);
    if (bVar2) {
      aValue_local = UnsafeVarTo<Js::JavascriptString>(pvVar10);
    }
    else {
      aValue_local = ToString(pvVar10,scriptContext);
    }
    break;
  case TypeIds_Symbol:
    this_02 = UnsafeVarTo<Js::JavascriptSymbol>(aValue);
    aValue_local = JavascriptSymbol::ToString(this_02,scriptContext);
  }
  return (JavascriptString *)aValue_local;
}

Assistant:

JavascriptString *JavascriptConversion::ToLocaleString(Var aValue, ScriptContext* scriptContext)
    {
        switch (JavascriptOperators::GetTypeId(aValue))
        {
        case TypeIds_Undefined:
            return scriptContext->GetLibrary()->GetUndefinedDisplayString();

        case TypeIds_Null:
            return scriptContext->GetLibrary()->GetNullDisplayString();

        case TypeIds_Integer:
            return JavascriptNumber::ToLocaleString(TaggedInt::ToInt32(aValue), scriptContext);

        case TypeIds_Boolean:
            return UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? scriptContext->GetLibrary()->GetTrueDisplayString() : scriptContext->GetLibrary()->GetFalseDisplayString();

        case TypeIds_Int64Number:
            return JavascriptNumber::ToLocaleString((double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue(), scriptContext);

        case TypeIds_UInt64Number:
            return JavascriptNumber::ToLocaleString((double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue(), scriptContext);

        case TypeIds_Number:
            return JavascriptNumber::ToLocaleString(JavascriptNumber::GetValue(aValue), scriptContext);

        case TypeIds_Symbol:
            return UnsafeVarTo<JavascriptSymbol>(aValue)->ToString(scriptContext);

        default:
            {
                RecyclableObject* object = VarTo<RecyclableObject>(aValue);
                Var value = JavascriptOperators::GetProperty(object, PropertyIds::toLocaleString, scriptContext, NULL);

                if (JavascriptConversion::IsCallable(value))
                {
                    RecyclableObject* toLocaleStringFunction = VarTo<RecyclableObject>(value);
                    Var aResult = scriptContext->GetThreadContext()->ExecuteImplicitCall(toLocaleStringFunction, Js::ImplicitCall_ToPrimitive, [=]()->Js::Var
                    {
                        return CALL_FUNCTION(scriptContext->GetThreadContext(), toLocaleStringFunction, CallInfo(1), aValue);
                    });
                    if (VarIs<JavascriptString>(aResult))
                    {
                        return UnsafeVarTo<JavascriptString>(aResult);
                    }
                    else
                    {
                        return JavascriptConversion::ToString(aResult, scriptContext);
                    }
                }

                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, scriptContext->GetPropertyName(PropertyIds::toLocaleString)->GetBuffer());
            }
        }
    }